

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_p.h
# Opt level: O0

void __thiscall QFSFileEnginePrivate::~QFSFileEnginePrivate(QFSFileEnginePrivate *this)

{
  QFileSystemEntry *in_RDI;
  
  (in_RDI->m_filePath).d.d = (Data *)&PTR__QFSFileEnginePrivate_00be2d88;
  QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength>::~QHash
            ((QHash<unsigned_char_*,_QFSFileEnginePrivate::StartAndLength> *)in_RDI);
  QFileSystemEntry::~QFileSystemEntry(in_RDI);
  QAbstractFileEnginePrivate::~QAbstractFileEnginePrivate((QAbstractFileEnginePrivate *)0x2bfc39);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QFSFileEnginePrivate : public QAbstractFileEnginePrivate
{
    Q_DECLARE_PUBLIC(QFSFileEngine)

public:
#ifdef Q_OS_WIN
    static QString longFileName(const QString &path);
#endif

    QFileSystemEntry fileEntry;
    QIODevice::OpenMode openMode;

    bool nativeOpen(QIODevice::OpenMode openMode, std::optional<QFile::Permissions> permissions);
    bool openFh(QIODevice::OpenMode flags, FILE *fh);
    bool openFd(QIODevice::OpenMode flags, int fd);
    bool nativeClose();
    bool closeFdFh();
    bool nativeFlush();
    bool nativeSyncToDisk();
    bool flushFh();
    qint64 nativeSize() const;
#ifndef Q_OS_WIN
    qint64 sizeFdFh() const;
#endif
    qint64 nativePos() const;
    qint64 posFdFh() const;
    bool nativeSeek(qint64);
    bool seekFdFh(qint64);
    qint64 nativeRead(char *data, qint64 maxlen);
    qint64 readFdFh(char *data, qint64 maxlen);
    qint64 nativeReadLine(char *data, qint64 maxlen);
    qint64 readLineFdFh(char *data, qint64 maxlen);
    qint64 nativeWrite(const char *data, qint64 len);
    qint64 writeFdFh(const char *data, qint64 len);
    int nativeHandle() const;
    bool nativeIsSequential() const;
#ifndef Q_OS_WIN
    bool isSequentialFdFh() const;
#endif
#ifdef Q_OS_WIN
    bool nativeRenameOverwrite(const QFileSystemEntry &newEntry);
#endif

    uchar *map(qint64 offset, qint64 size, QFile::MemoryMapFlags flags);
    bool unmap(uchar *ptr);
    void unmapAll();

    mutable QFileSystemMetaData metaData;

    FILE *fh;

#ifdef Q_OS_WIN
    HANDLE fileHandle;
    HANDLE mapHandle;
    QHash<uchar *, DWORD /* offset % AllocationGranularity */> maps;

    mutable int cachedFd;
    mutable DWORD fileAttrib;
#else
    struct StartAndLength {
        int start;     // offset % PageSize
        size_t length; // length + offset % PageSize
    };
    QHash<uchar *, StartAndLength> maps;
#endif
    int fd;

    enum LastIOCommand
    {
        IOFlushCommand,
        IOReadCommand,
        IOWriteCommand
    };
    LastIOCommand  lastIOCommand;
    bool lastFlushFailed;
    bool closeFileHandle;

    mutable uint is_sequential : 2;
    mutable uint tried_stat : 1;
    mutable uint need_lstat : 1;
    mutable uint is_link : 1;

#if defined(Q_OS_WIN)
    bool doStat(QFileSystemMetaData::MetaDataFlags flags) const;
#else
    bool doStat(QFileSystemMetaData::MetaDataFlags flags = QFileSystemMetaData::PosixStatFlags) const;
#endif
    bool isSymlink() const;

#if defined(Q_OS_WIN32)
    int sysOpen(const QString &, int flags);
#endif

    static bool openModeCanCreate(QIODevice::OpenMode openMode)
    {
        // WriteOnly can create, but only when ExistingOnly isn't specified.
        // ReadOnly by itself never creates.
        return (openMode & QFile::WriteOnly) && !(openMode & QFile::ExistingOnly);
    }
protected:
    QFSFileEnginePrivate(QAbstractFileEngine *q);

    void init();

    QAbstractFileEngine::FileFlags getPermissions(QAbstractFileEngine::FileFlags type) const;

#ifdef Q_OS_UNIX
    bool nativeOpenImpl(QIODevice::OpenMode openMode, mode_t mode);
#endif
}